

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O0

node_type * __thiscall
st_tree::detail::
node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
::_copy_data(node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
             *this,tree_type *tree_)

{
  bool bVar1;
  reference ppnVar2;
  node_type *local_38;
  node_type *c;
  _Self local_28;
  cs_const_iterator j;
  node_type *n;
  tree_type *tree__local;
  node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>
  *this_local;
  
  j._M_node = (_Base_ptr)
              tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>::_new_node
                        (tree_);
  ut_ordered::emplace_subnodes::test_method::str1::operator=
            ((str1 *)(j._M_node + 1),
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._data);
  max_maintainer<unsigned_long,_std::allocator<str1>_>::operator=
            ((max_maintainer<unsigned_long,_std::allocator<str1>_> *)(j._M_node + 4),
             &(this->
              super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
              )._depth);
  local_28._M_node =
       (_Base_ptr)
       std::
       multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
       ::begin(&(this->
                super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
                )._children);
  while( true ) {
    c = (node_type *)
        std::
        multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
        ::end(&(this->
               super_node_base<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>_>
               )._children);
    bVar1 = std::operator!=(&local_28,(_Self *)&c);
    if (!bVar1) break;
    ppnVar2 = std::
              _Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>
              ::operator*(&local_28);
    local_38 = _copy_data(*ppnVar2,tree_);
    std::
    multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
    ::insert((multiset<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*,_st_tree::detail::ptr_less_data<std::less<str1>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>_>
              *)&j._M_node[2]._M_parent,&local_38);
    std::
    _Rb_tree_const_iterator<st_tree::detail::node_ordered<st_tree::tree<str1,_st_tree::ordered<st_tree::arg_default>,_std::allocator<str1>_>,_str1,_std::less<str1>_>_*>
    ::operator++(&local_28);
  }
  return (node_type *)j._M_node;
}

Assistant:

node_type* _copy_data(tree_type& tree_) const {
        node_type* n = tree_._new_node();
        n->_data = this->_data;
        n->_depth = this->_depth;
        for (cs_const_iterator j(this->_children.begin());  j != this->_children.end();  ++j) {
            node_type* c((*j)->_copy_data(tree_));
            n->_children.insert(c);
        }
        return n;
    }